

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O0

void Abc_NodeSuperChoiceCollect(Abc_Obj_t *pRoot,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vVolume)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  int local_2c;
  int nLeaves;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vVolume_local;
  Vec_Ptr_t *vLeaves_local;
  Abc_Obj_t *pRoot_local;
  
  iVar1 = Vec_PtrSize(vLeaves);
  for (local_2c = 0; iVar2 = Vec_PtrSize(vLeaves), local_2c < iVar2; local_2c = local_2c + 1) {
    pvVar3 = Vec_PtrEntry(vLeaves,local_2c);
    *(uint *)((long)pvVar3 + 0x14) = *(uint *)((long)pvVar3 + 0x14) & 0xffffffbf | 0x40;
    *(uint *)((long)pvVar3 + 0x14) = *(uint *)((long)pvVar3 + 0x14) & 0xffffffdf | 0x20;
  }
  Vec_PtrClear(vVolume);
  Vec_PtrClear(vLeaves);
  Abc_NodeSuperChoiceCollect_rec(pRoot,vLeaves,vVolume);
  iVar2 = Vec_PtrSize(vLeaves);
  if (iVar2 != iVar1) {
    __assert_fail("Vec_PtrSize(vLeaves) == nLeaves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                  ,0x1db,"void Abc_NodeSuperChoiceCollect(Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(vLeaves), local_2c < iVar1; local_2c = local_2c + 1) {
    pvVar3 = Vec_PtrEntry(vLeaves,local_2c);
    *(uint *)((long)pvVar3 + 0x14) = *(uint *)((long)pvVar3 + 0x14) & 0xffffffbf;
  }
  for (local_2c = 0; iVar1 = Vec_PtrSize(vVolume), local_2c < iVar1; local_2c = local_2c + 1) {
    pvVar3 = Vec_PtrEntry(vVolume,local_2c);
    *(uint *)((long)pvVar3 + 0x14) = *(uint *)((long)pvVar3 + 0x14) & 0xffffffbf;
  }
  return;
}

Assistant:

void Abc_NodeSuperChoiceCollect( Abc_Obj_t * pRoot, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vVolume )
{
    Abc_Obj_t * pObj;
    int i, nLeaves;
    nLeaves = Vec_PtrSize(vLeaves);
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
        pObj->fMarkB = pObj->fMarkC = 1;
    Vec_PtrClear( vVolume );
    Vec_PtrClear( vLeaves );
    Abc_NodeSuperChoiceCollect_rec( pRoot, vLeaves, vVolume );
    assert( Vec_PtrSize(vLeaves) == nLeaves );
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pObj, i )
        pObj->fMarkC = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vVolume, pObj, i )
        pObj->fMarkC = 0;
}